

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_and_snapshot_test(void)

{
  fdb_encryption_key *fconfig;
  void *pvVar1;
  fdb_doc *doc;
  undefined8 uVar2;
  fdb_status fVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *handle;
  int iVar7;
  fdb_config *fconfig_00;
  ulong uVar8;
  fdb_kvs_handle *pfVar9;
  uint uVar10;
  fdb_kvs_handle *doc_00;
  char *pcVar11;
  long lVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_seqnum_t fVar15;
  fdb_kvs_handle *config;
  fdb_kvs_config *config_00;
  char *pcVar16;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snapshot;
  size_t vallen;
  void *val;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_iterator *pfStack_f20;
  fdb_doc *pfStack_f18;
  fdb_kvs_handle *pfStack_f10;
  timeval tStack_f08;
  char acStack_ef8 [256];
  char acStack_df8 [264];
  fdb_kvs_handle *pfStack_cf0;
  fdb_kvs_handle *pfStack_ce8;
  fdb_kvs_handle *pfStack_ce0;
  fdb_kvs_config *pfStack_cd8;
  fdb_kvs_handle *pfStack_cd0;
  fdb_kvs_handle *pfStack_cc8;
  fdb_kvs_handle *pfStack_cb8;
  fdb_custom_cmp_variable p_Stack_cb0;
  fdb_kvs_handle *pfStack_ca8;
  fdb_kvs_handle *pfStack_ca0;
  fdb_kvs_handle *pfStack_c98;
  kvs_ops_stat *pkStack_c90;
  hbtrie *phStack_c88;
  hbtrie *phStack_c80;
  fdb_kvs_config fStack_c78;
  timeval tStack_c60;
  undefined1 auStack_c50 [512];
  fdb_config fStack_a50;
  fdb_kvs_handle *pfStack_958;
  fdb_kvs_handle *pfStack_950;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  fdb_kvs_handle *pfStack_930;
  undefined1 auStack_918 [16];
  fdb_kvs_handle *pfStack_908;
  fdb_file_handle *pfStack_900;
  undefined1 auStack_8f8 [40];
  undefined1 auStack_8d0 [280];
  undefined1 auStack_7b8 [336];
  timeval tStack_668;
  fdb_kvs_handle fStack_658;
  fdb_kvs_handle *pfStack_450;
  fdb_seqnum_t fStack_448;
  undefined1 *puStack_440;
  fdb_kvs_handle *pfStack_438;
  undefined1 auStack_428 [24];
  undefined1 auStack_410 [64];
  fdb_kvs_config fStack_3d0;
  fdb_config fStack_3b8;
  char acStack_2c0 [264];
  fdb_config *pfStack_1b8;
  fdb_kvs_handle *local_180;
  fdb_file_handle *local_178;
  fdb_kvs_handle *local_170;
  size_t local_168;
  void *local_160;
  fdb_kvs_info local_158;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &local_100;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar3 = fdb_open(&local_178,"mvcc_test",fconfig_00);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_kvs_open(local_178,&local_180,(char *)0x0,&local_128);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b87;
    fVar3 = fdb_set_kv(local_180,"a",1,"val-a",5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b8c;
    fVar3 = fdb_commit(local_178,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b91;
    fVar3 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b96;
    fVar3 = fdb_set_kv(local_180,"b",1,"val-b",5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116b9b;
    fVar3 = fdb_commit(local_178,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116ba0;
    fVar3 = fdb_get_kvs_info(local_180,&local_158);
    fVar15 = local_158.last_seqnum;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116ba5;
    fVar3 = fdb_set_kv(local_180,"c",1,"val-c",5);
    fconfig_00 = (fdb_config *)fVar15;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116baa;
    fVar3 = fdb_commit(local_178,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116baf;
    fVar3 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bb4;
    fVar3 = fdb_rollback(&local_180,fVar15);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bb9;
    fVar3 = fdb_get_kvs_info(local_180,&local_158);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bbe;
    fVar3 = fdb_get_kv(local_180,"c",1,&local_160,&local_168);
    fconfig_00 = (fdb_config *)local_158.last_seqnum;
    if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116bc3;
    fVar3 = fdb_snapshot_open(local_180,&local_170,local_158.last_seqnum);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116bc8;
    fVar3 = fdb_get_kv(local_170,"c",1,&local_160,&local_168);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      fdb_kvs_close(local_170);
      fdb_close(local_178);
      fdb_shutdown();
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_and_snapshot_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar11,"rollback and snapshot test");
      return;
    }
  }
  else {
    rollback_and_snapshot_test();
LAB_00116b87:
    rollback_and_snapshot_test();
LAB_00116b8c:
    rollback_and_snapshot_test();
LAB_00116b91:
    rollback_and_snapshot_test();
LAB_00116b96:
    rollback_and_snapshot_test();
LAB_00116b9b:
    rollback_and_snapshot_test();
LAB_00116ba0:
    rollback_and_snapshot_test();
LAB_00116ba5:
    rollback_and_snapshot_test();
LAB_00116baa:
    rollback_and_snapshot_test();
LAB_00116baf:
    rollback_and_snapshot_test();
LAB_00116bb4:
    rollback_and_snapshot_test();
LAB_00116bb9:
    rollback_and_snapshot_test();
LAB_00116bbe:
    rollback_and_snapshot_test();
LAB_00116bc3:
    rollback_and_snapshot_test();
LAB_00116bc8:
    rollback_and_snapshot_test();
  }
  rollback_and_snapshot_test();
  pfStack_438 = (fdb_kvs_handle *)0x116bef;
  pfStack_1b8 = fconfig_00;
  gettimeofday((timeval *)(auStack_410 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_438 = (fdb_kvs_handle *)0x116bf4;
  memleak_start();
  pfStack_438 = (fdb_kvs_handle *)0x116c01;
  fdb_get_default_config();
  pfStack_438 = (fdb_kvs_handle *)0x116c0e;
  fdb_get_default_kvs_config();
  pfStack_438 = (fdb_kvs_handle *)0x116c1a;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fStack_3b8.wal_threshold = 0x400;
  fStack_3b8.flags = 1;
  fStack_3b8.compaction_threshold = '\0';
  fStack_3b8.block_reusing_threshold = 0;
  pfStack_438 = (fdb_kvs_handle *)0x116c51;
  fdb_open((fdb_file_handle **)(auStack_428 + 8),"./mvcc_test1",&fStack_3b8);
  pfStack_438 = (fdb_kvs_handle *)0x116c68;
  fdb_kvs_open((fdb_file_handle *)auStack_428._8_8_,(fdb_kvs_handle **)auStack_428,"kv1",&fStack_3d0
              );
  pfStack_438 = (fdb_kvs_handle *)0x116c7a;
  fdb_kvs_open((fdb_file_handle *)auStack_428._8_8_,(fdb_kvs_handle **)(auStack_428 + 0x10),
               (char *)0x0,&fStack_3d0);
  uVar8 = 0;
  do {
    iVar7 = 0;
    do {
      pfStack_438 = (fdb_kvs_handle *)0x116ca3;
      sprintf(acStack_2c0,"key%02d%03d",uVar8);
      uVar2 = auStack_428._0_8_;
      pfStack_438 = (fdb_kvs_handle *)0x116cb0;
      sVar4 = strlen(acStack_2c0);
      pfStack_438 = (fdb_kvs_handle *)0x116cc3;
      fdb_set_kv((fdb_kvs_handle *)uVar2,acStack_2c0,sVar4,(void *)0x0,0);
      uVar2 = auStack_428._16_8_;
      pfStack_438 = (fdb_kvs_handle *)0x116cd0;
      sVar4 = strlen(acStack_2c0);
      pfStack_438 = (fdb_kvs_handle *)0x116ce3;
      fdb_set_kv((fdb_kvs_handle *)uVar2,acStack_2c0,sVar4,(void *)0x0,0);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 100);
    pfStack_438 = (fdb_kvs_handle *)0x116cf9;
    fdb_commit((fdb_file_handle *)auStack_428._8_8_,(byte)uVar8 & 1);
    pfStack_438 = (fdb_kvs_handle *)0x116d06;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_428._0_8_,(fdb_kvs_info *)auStack_410);
    if (auStack_410._16_8_ != auStack_410._8_8_) {
      pfStack_438 = (fdb_kvs_handle *)0x116d2e;
      rollback_ncommits();
    }
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 != 10);
  doc_00 = (fdb_kvs_handle *)0xb;
  fVar15 = 1000;
  pfVar13 = (fdb_kvs_handle *)auStack_428;
  pfVar14 = (fdb_kvs_handle *)auStack_410;
  while( true ) {
    pfStack_438 = (fdb_kvs_handle *)0x116d5a;
    fVar3 = fdb_rollback((fdb_kvs_handle **)pfVar13,fVar15);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfStack_438 = (fdb_kvs_handle *)0x116d6f;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_428._0_8_,(fdb_kvs_info *)pfVar14);
    if (auStack_410._16_8_ != auStack_410._8_8_) {
      pfStack_438 = (fdb_kvs_handle *)0x116d95;
      rollback_ncommits();
    }
    doc_00 = (fdb_kvs_handle *)((long)&doc_00[-1].bub_ctx.handle + 7);
    fVar15 = fVar15 - 100;
    if (doc_00 < (fdb_kvs_handle *)0x2) {
      pfStack_438 = (fdb_kvs_handle *)0x116da1;
      fdb_kvs_close((fdb_kvs_handle *)auStack_428._0_8_);
      pfStack_438 = (fdb_kvs_handle *)0x116dab;
      fdb_close((fdb_file_handle *)auStack_428._8_8_);
      pfStack_438 = (fdb_kvs_handle *)0x116db0;
      fdb_shutdown();
      pfStack_438 = (fdb_kvs_handle *)0x116db5;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_ncommits()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_438 = (fdb_kvs_handle *)0x116de6;
      fprintf(_stderr,pcVar11,"rollback n commits");
      return;
    }
  }
  pfStack_438 = (fdb_kvs_handle *)transaction_test;
  rollback_ncommits();
  pfStack_930 = (fdb_kvs_handle *)0x116e1d;
  fStack_658.bub_ctx.space_used = (uint64_t)(auStack_410 + 0x10);
  fStack_658.bub_ctx.handle = pfVar13;
  pfStack_450 = pfVar14;
  fStack_448 = fVar15;
  puStack_440 = auStack_410 + 8;
  pfStack_438 = doc_00;
  gettimeofday(&tStack_668,(__timezone_ptr_t)0x0);
  pfStack_930 = (fdb_kvs_handle *)0x116e22;
  memleak_start();
  pfStack_930 = (fdb_kvs_handle *)0x116e2e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_930 = (fdb_kvs_handle *)0x116e3e;
  fdb_get_default_config();
  config = (fdb_kvs_handle *)auStack_8d0;
  pfStack_930 = (fdb_kvs_handle *)0x116e4b;
  fdb_get_default_kvs_config();
  fStack_658.config.encryption_key.bytes[4] = '\0';
  fStack_658.config.encryption_key.bytes[5] = '\0';
  fStack_658.config.encryption_key.bytes[6] = '\0';
  fStack_658.config.encryption_key.bytes[7] = '\0';
  fStack_658.config.encryption_key.bytes[8] = '\0';
  fStack_658.config.encryption_key.bytes[9] = '\0';
  fStack_658.config.encryption_key.bytes[10] = '\0';
  fStack_658.config.encryption_key.bytes[0xb] = '\0';
  fStack_658.config.encryption_key.bytes[0xc] = '\0';
  fStack_658.config.encryption_key.bytes[0xd] = '\x04';
  fStack_658.config.encryption_key.bytes[0xe] = '\0';
  fStack_658.config.encryption_key.bytes[0xf] = '\0';
  fStack_658.config.encryption_key.bytes[0x10] = '\0';
  fStack_658.config.encryption_key.bytes[0x11] = '\0';
  fStack_658.config.encryption_key.bytes[0x12] = '\0';
  fStack_658.config.encryption_key.bytes[0x13] = '\0';
  fStack_658.config._180_4_ = 1;
  fStack_658.config.encryption_key.bytes[0x18] = '\0';
  fStack_658.config.encryption_key.bytes[0x19] = '\0';
  fStack_658.config.encryption_key.bytes[0x1a] = '\0';
  fStack_658.config.encryption_key.bytes[0x1b] = '\0';
  fStack_658.config.block_reusing_threshold._7_1_ = 0;
  pfVar9 = (fdb_kvs_handle *)auStack_8f8;
  pfStack_930 = (fdb_kvs_handle *)0x116e84;
  fdb_open((fdb_file_handle **)pfVar9,"mvcc_test1",(fdb_config *)&fStack_658.config.encryption_key);
  pcVar11 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x116e97;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)config);
  pfStack_930 = (fdb_kvs_handle *)0x116ead;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e41;
  fconfig = &fStack_658.config.encryption_key;
  pfStack_930 = (fdb_kvs_handle *)0x116ed7;
  fdb_open(&pfStack_900,"mvcc_test1",(fdb_config *)fconfig);
  pfStack_930 = (fdb_kvs_handle *)0x116eea;
  fdb_open((fdb_file_handle **)(auStack_8f8 + 0x10),"mvcc_test1",(fdb_config *)fconfig);
  pfStack_930 = (fdb_kvs_handle *)0x116eff;
  fdb_kvs_open_default(pfStack_900,&pfStack_908,(fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x116f10;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._16_8_,(fdb_kvs_handle **)(auStack_8f8 + 8),
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x116f1d;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfStack_930 = (fdb_kvs_handle *)0x116f2b;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\x02');
  lVar12 = 0;
  uVar8 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x116f4b;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar8 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x116f63;
    sprintf((char *)&fStack_658,"meta%d",uVar8 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x116f78;
    sprintf(auStack_8d0 + 0x18,"body%d",uVar8 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x116f8b;
    sVar4 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x116f9e;
    sVar5 = strlen((char *)&fStack_658);
    pfStack_930 = (fdb_kvs_handle *)0x116fab;
    sVar6 = strlen(auStack_8d0 + 0x18);
    pfStack_930 = (fdb_kvs_handle *)0x116fcd;
    fdb_doc_create((fdb_doc **)(auStack_7b8 + lVar12),auStack_7b8 + 0x50,sVar4,&fStack_658,sVar5,
                   auStack_8d0 + 0x18,sVar6);
    pfStack_930 = (fdb_kvs_handle *)0x116fdf;
    fdb_set(pfStack_908,*(fdb_doc **)(auStack_7b8 + uVar8 * 8));
    uVar8 = uVar8 + 1;
    lVar12 = lVar12 + 8;
  } while (uVar8 != 5);
  uVar8 = 5;
  pfVar14 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117016;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar8 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x11702e;
    sprintf((char *)&fStack_658,"meta%d",uVar8 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x117043;
    sprintf(auStack_8d0 + 0x18,"body%d",uVar8 & 0xffffffff);
    pfVar13 = (fdb_kvs_handle *)(auStack_7b8 + (long)pfVar14);
    pfStack_930 = (fdb_kvs_handle *)0x117056;
    sVar4 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x117069;
    sVar5 = strlen((char *)&fStack_658);
    pfStack_930 = (fdb_kvs_handle *)0x117076;
    sVar6 = strlen(auStack_8d0 + 0x18);
    pfStack_930 = (fdb_kvs_handle *)0x117098;
    fdb_doc_create((fdb_doc **)pfVar13,auStack_7b8 + 0x50,sVar4,&fStack_658,sVar5,auStack_8d0 + 0x18
                   ,sVar6);
    pfStack_930 = (fdb_kvs_handle *)0x1170aa;
    fdb_set((fdb_kvs_handle *)auStack_8f8._8_8_,*(fdb_doc **)(auStack_7b8 + uVar8 * 8));
    uVar8 = uVar8 + 1;
    pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
  } while (uVar8 != 10);
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1170e0;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1170e8;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117106;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117115;
    fVar3 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e23;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e28;
    pfStack_930 = (fdb_kvs_handle *)0x117135;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117158;
  fdb_open((fdb_file_handle **)(auStack_8f8 + 0x18),"mvcc_test1",
           (fdb_config *)&fStack_658.config.encryption_key);
  pfStack_930 = (fdb_kvs_handle *)0x11716a;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._24_8_,(fdb_kvs_handle **)(auStack_8f8 + 0x20),
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x117177;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._24_8_,'\x03');
  pcVar11 = auStack_7b8 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x11719c;
    sprintf(pcVar11,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1171a4;
    sVar4 = strlen(pcVar11);
    pfStack_930 = (fdb_kvs_handle *)0x1171c2;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1171d1;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_8f8._32_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pfStack_930 = (fdb_kvs_handle *)0x117d8b;
      transaction_test();
      goto LAB_00117d8b;
    }
    pfStack_930 = (fdb_kvs_handle *)0x1171e3;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x1171f6;
  fdb_end_transaction((fdb_file_handle *)auStack_8f8._24_8_,'\0');
  pfStack_930 = (fdb_kvs_handle *)0x117200;
  fdb_close((fdb_file_handle *)auStack_8f8._24_8_);
  pfStack_930 = (fdb_kvs_handle *)0x11720c;
  fdb_end_transaction(pfStack_900,'\0');
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117231;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117239;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117257;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117266;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e2d;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e32;
    pfStack_930 = (fdb_kvs_handle *)0x117286;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1172b2;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1172ba;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x1172d8;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1172e7;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d8b;
    pfStack_930 = (fdb_kvs_handle *)0x1172f9;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x11730a;
  fdb_abort_transaction((fdb_file_handle *)auStack_8f8._16_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117317;
  fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x11732e;
  fdb_open((fdb_file_handle **)auStack_8f8,"mvcc_test1",
           (fdb_config *)&fStack_658.config.encryption_key);
  pcVar11 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x117343;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x117359;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  pcVar16 = (char *)pfVar13;
  handle = pfVar14;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e46;
  pcVar11 = "key%d";
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117386;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x11738e;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x1173ac;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1173bb;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if ((uint)doc_00 < 5) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e37;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00117e3c;
    pfStack_930 = (fdb_kvs_handle *)0x1173db;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (uint)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  lVar12 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1173f6;
    fdb_set((fdb_kvs_handle *)auStack_918._8_8_,*(fdb_doc **)(auStack_7b8 + lVar12 * 8 + 0x28));
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  pfStack_930 = (fdb_kvs_handle *)0x11740b;
  fdb_commit((fdb_file_handle *)auStack_8f8._0_8_,'\0');
  pcVar11 = auStack_7b8 + 0x50;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117430;
    sprintf(pcVar11,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x117438;
    sVar4 = strlen(pcVar11);
    pfStack_930 = (fdb_kvs_handle *)0x117456;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117465;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117d90;
    pfStack_930 = (fdb_kvs_handle *)0x117477;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x11748d;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfStack_930 = (fdb_kvs_handle *)0x11749c;
  fdb_begin_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\x02');
  uVar8 = 0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1174bb;
    sprintf(auStack_7b8 + 0x50,"key%d",uVar8);
    doc_00 = &fStack_658;
    pfStack_930 = (fdb_kvs_handle *)0x1174d7;
    sprintf((char *)doc_00,"meta%d",uVar8);
    pcVar16 = auStack_8d0 + 0x18;
    pfStack_930 = (fdb_kvs_handle *)0x1174f0;
    sprintf(pcVar16,"body%d_txn1",uVar8);
    pfStack_930 = (fdb_kvs_handle *)0x1174f8;
    sVar4 = strlen(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x117503;
    sVar5 = strlen((char *)doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x11750e;
    sVar6 = strlen(pcVar16);
    pcVar11 = auStack_7b8 + 0x50;
    pfStack_930 = (fdb_kvs_handle *)0x117533;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar11,sVar4,doc_00,sVar5,pcVar16,sVar6);
    pfStack_930 = (fdb_kvs_handle *)0x117542;
    fdb_set(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x11754c;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x117560;
    sprintf(pcVar16,"body%d_txn2",uVar8);
    pfStack_930 = (fdb_kvs_handle *)0x117568;
    sVar4 = strlen(pcVar11);
    pfStack_930 = (fdb_kvs_handle *)0x117573;
    sVar5 = strlen((char *)doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x11757e;
    sVar6 = strlen(pcVar16);
    pfStack_930 = (fdb_kvs_handle *)0x11759b;
    fdb_doc_create((fdb_doc **)auStack_918,pcVar11,sVar4,doc_00,sVar5,pcVar16,sVar6);
    pfStack_930 = (fdb_kvs_handle *)0x1175aa;
    fdb_set((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfStack_930 = (fdb_kvs_handle *)0x1175b4;
    fdb_doc_free((fdb_doc *)auStack_918._0_8_);
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (uVar10 != 10);
  pfVar14 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x1175e8;
    sprintf((char *)config,"key%d",(ulong)pcVar11 & 0xffffffff);
    pfStack_930 = (fdb_kvs_handle *)0x1175f0;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x11760e;
    fdb_doc_create((fdb_doc **)pfVar14,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x11761d;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfVar13 = (fdb_kvs_handle *)auStack_918._0_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117da0;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfVar9 = *(fdb_kvs_handle **)(*(long *)(auStack_7b8 + (long)pcVar11 * 8) + 0x40);
    pfStack_930 = (fdb_kvs_handle *)0x117651;
    iVar7 = bcmp(doc_00,pfVar9,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    config = handle;
    if (iVar7 != 0) goto LAB_00117d95;
    pfStack_930 = (fdb_kvs_handle *)0x117661;
    fdb_doc_free((fdb_doc *)pfVar13);
    pcVar16 = auStack_7b8 + 0x50;
    pfStack_930 = (fdb_kvs_handle *)0x117671;
    sVar4 = strlen(pcVar16);
    pfStack_930 = (fdb_kvs_handle *)0x117692;
    fdb_doc_create((fdb_doc **)pfVar14,pcVar16,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1176a1;
    fVar3 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    pfVar13 = pfVar14;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117db2;
    pfStack_930 = (fdb_kvs_handle *)0x1176bf;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar11 & 0xffffffff);
    pcVar16 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x1176d9;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117da5;
    pfStack_930 = (fdb_kvs_handle *)0x1176e9;
    fdb_doc_free((fdb_doc *)pcVar16);
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfStack_930 = (fdb_kvs_handle *)0x1176f9;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117717;
    fdb_doc_create((fdb_doc **)pfVar14,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117726;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_8f8._8_8_,(fdb_doc *)auStack_918._0_8_);
    pfVar9 = pfVar14;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dc4;
    pfStack_930 = (fdb_kvs_handle *)0x117741;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar11 & 0xffffffff);
    pcVar16 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x11775b;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117db7;
    pfStack_930 = (fdb_kvs_handle *)0x11776b;
    fdb_doc_free((fdb_doc *)pcVar16);
    pcVar11 = &(((fdb_kvs_handle *)pcVar11)->kvs_config).field_0x1;
  } while (pcVar11 != (undefined1 *)0xa);
  pfStack_930 = (fdb_kvs_handle *)0x117784;
  fdb_end_transaction((fdb_file_handle *)auStack_8f8._16_8_,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar11 = (char *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1177ab;
    sprintf((char *)config,"key%d",pcVar11);
    pfStack_930 = (fdb_kvs_handle *)0x1177b3;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x1177d1;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x1177e0;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dd6;
    pfStack_930 = (fdb_kvs_handle *)0x1177fb;
    sprintf((char *)handle,"body%d_txn2",pcVar11);
    pcVar16 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117815;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117dc9;
    pfStack_930 = (fdb_kvs_handle *)0x117825;
    fdb_doc_free((fdb_doc *)pcVar16);
    pfStack_930 = (fdb_kvs_handle *)0x11782d;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x11784b;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x11785a;
    fVar3 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117de8;
    pfStack_930 = (fdb_kvs_handle *)0x117875;
    sprintf((char *)handle,"body%d_txn1",pcVar11);
    pcVar16 = (char *)auStack_918._0_8_;
    doc_00 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x11788f;
    iVar7 = bcmp(doc_00,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117ddb;
    pfStack_930 = (fdb_kvs_handle *)0x11789f;
    fdb_doc_free((fdb_doc *)pcVar16);
    uVar10 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x1178b6;
  fdb_end_transaction(pfStack_900,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pcVar16 = "body%d_txn1";
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x1178df;
    sprintf((char *)config,"key%d",doc_00);
    pfStack_930 = (fdb_kvs_handle *)0x1178e7;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117907;
    fdb_doc_create((fdb_doc **)auStack_918,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117916;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dfa;
    pfStack_930 = (fdb_kvs_handle *)0x11792d;
    sprintf((char *)handle,"body%d_txn1",doc_00);
    pcVar11 = (char *)auStack_918._0_8_;
    pfVar9 = (fdb_kvs_handle *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117945;
    iVar7 = bcmp(pfVar9,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117ded;
    pfStack_930 = (fdb_kvs_handle *)0x117955;
    fdb_doc_free((fdb_doc *)pcVar11);
    uVar10 = (int)doc_00 + 1;
    doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x11796f;
  fdb_begin_transaction(pfStack_900,'\x02');
  pfVar13 = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfStack_930 = (fdb_kvs_handle *)0x11798d;
  sprintf((char *)pfVar13,"key%d",5);
  pfVar9 = &fStack_658;
  pfStack_930 = (fdb_kvs_handle *)0x1179ab;
  sprintf((char *)pfVar9,"meta%d",5);
  pcVar16 = auStack_8d0 + 0x18;
  pfStack_930 = (fdb_kvs_handle *)0x1179c6;
  sprintf(pcVar16,"body%d_before_compaction",5);
  pfStack_930 = (fdb_kvs_handle *)0x1179ce;
  handle = (fdb_kvs_handle *)strlen((char *)pfVar13);
  pfStack_930 = (fdb_kvs_handle *)0x1179d9;
  doc_00 = (fdb_kvs_handle *)strlen((char *)pfVar9);
  pfStack_930 = (fdb_kvs_handle *)0x1179e4;
  sVar4 = strlen(pcVar16);
  config = (fdb_kvs_handle *)auStack_918;
  pfStack_930 = (fdb_kvs_handle *)0x117a04;
  fdb_doc_create((fdb_doc **)config,pfVar13,(size_t)handle,pfVar9,(size_t)doc_00,pcVar16,sVar4);
  pfStack_930 = (fdb_kvs_handle *)0x117a11;
  fdb_set(pfStack_908,(fdb_doc *)auStack_918._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117a19;
  fdb_doc_free((fdb_doc *)auStack_918._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117a2a;
  fdb_compact((fdb_file_handle *)auStack_8f8._0_8_,"mvcc_test2");
  pfStack_930 = (fdb_kvs_handle *)0x117a32;
  sVar4 = strlen((char *)pfVar13);
  pfStack_930 = (fdb_kvs_handle *)0x117a50;
  fdb_doc_create((fdb_doc **)config,pfVar13,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_930 = (fdb_kvs_handle *)0x117a5d;
  fVar3 = fdb_get(pfStack_908,(fdb_doc *)auStack_918._0_8_);
  pcVar11 = (char *)auStack_918._0_8_;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e4b;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
  pfStack_930 = (fdb_kvs_handle *)0x117a7f;
  iVar7 = bcmp(config,auStack_8d0 + 0x18,
               (size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
  if (iVar7 != 0) goto LAB_00117e50;
  pfStack_930 = (fdb_kvs_handle *)0x117a8f;
  fdb_doc_free((fdb_doc *)pcVar11);
  pcVar11 = auStack_7b8 + 0x50;
  pfStack_930 = (fdb_kvs_handle *)0x117a9f;
  sVar4 = strlen(pcVar11);
  config = (fdb_kvs_handle *)auStack_918;
  pfStack_930 = (fdb_kvs_handle *)0x117ac2;
  fdb_doc_create((fdb_doc **)config,pcVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_930 = (fdb_kvs_handle *)0x117acf;
  fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e5d;
  pfVar9 = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pfStack_930 = (fdb_kvs_handle *)0x117af2;
  sprintf((char *)pfVar9,"body%d_txn1",5);
  pcVar11 = (char *)auStack_918._0_8_;
  config = (fdb_kvs_handle *)
           ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))->seqtree;
  pfStack_930 = (fdb_kvs_handle *)0x117b0a;
  iVar7 = bcmp(config,pfVar9,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
  if (iVar7 != 0) goto LAB_00117e62;
  pfStack_930 = (fdb_kvs_handle *)0x117b1a;
  fdb_doc_free((fdb_doc *)pcVar11);
  pfStack_930 = (fdb_kvs_handle *)0x117b26;
  fdb_end_transaction(pfStack_900,'\0');
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
  pcVar16 = (char *)0x0;
  do {
    pfStack_930 = (fdb_kvs_handle *)0x117b4f;
    sprintf((char *)config,"key%d",pcVar16);
    pfStack_930 = (fdb_kvs_handle *)0x117b57;
    sVar4 = strlen((char *)config);
    pfStack_930 = (fdb_kvs_handle *)0x117b75;
    fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_930 = (fdb_kvs_handle *)0x117b84;
    fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e0c;
    if ((int)pcVar16 == 5) {
      pcVar11 = "body%d_before_compaction";
      pfVar13 = (fdb_kvs_handle *)0x5;
    }
    else {
      pcVar11 = "body%d_txn1";
      pfVar13 = (fdb_kvs_handle *)pcVar16;
    }
    pfStack_930 = (fdb_kvs_handle *)0x117bb4;
    sprintf((char *)handle,pcVar11,pfVar13);
    doc_00 = (fdb_kvs_handle *)auStack_918._0_8_;
    pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40))
                      ->seqtree;
    pfStack_930 = (fdb_kvs_handle *)0x117bcc;
    iVar7 = bcmp(pcVar11,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
    if (iVar7 != 0) goto LAB_00117dff;
    pfStack_930 = (fdb_kvs_handle *)0x117bdc;
    fdb_doc_free((fdb_doc *)doc_00);
    uVar10 = (int)pcVar16 + 1;
    pcVar16 = (char *)(ulong)uVar10;
  } while (uVar10 != 10);
  pfStack_930 = (fdb_kvs_handle *)0x117bf6;
  fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
  pfStack_930 = (fdb_kvs_handle *)0x117c0d;
  fdb_open((fdb_file_handle **)auStack_8f8,"mvcc_test2",
           (fdb_config *)&fStack_658.config.encryption_key);
  pcVar11 = auStack_918 + 8;
  pfStack_930 = (fdb_kvs_handle *)0x117c22;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_8f8._0_8_,(fdb_kvs_handle **)pcVar11,
             (fdb_kvs_config *)auStack_8d0);
  pfStack_930 = (fdb_kvs_handle *)0x117c38;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_918._8_8_,logCallbackFunc,"transaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
    pfVar9 = (fdb_kvs_handle *)auStack_918;
    handle = (fdb_kvs_handle *)(auStack_8d0 + 0x18);
    pcVar16 = (char *)0x0;
    while( true ) {
      pfStack_930 = (fdb_kvs_handle *)0x117c69;
      sprintf((char *)config,"key%d",pcVar16);
      pfStack_930 = (fdb_kvs_handle *)0x117c71;
      sVar4 = strlen((char *)config);
      pfStack_930 = (fdb_kvs_handle *)0x117c8f;
      fdb_doc_create((fdb_doc **)pfVar9,config,sVar4,(void *)0x0,0,(void *)0x0,0);
      pfStack_930 = (fdb_kvs_handle *)0x117c9e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_918._8_8_,(fdb_doc *)auStack_918._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar16 == 5) {
        pcVar11 = "body%d_before_compaction";
        pfVar13 = (fdb_kvs_handle *)0x5;
      }
      else {
        pcVar11 = "body%d_txn1";
        pfVar13 = (fdb_kvs_handle *)pcVar16;
      }
      pfStack_930 = (fdb_kvs_handle *)0x117cce;
      sprintf((char *)handle,pcVar11,pfVar13);
      doc_00 = (fdb_kvs_handle *)auStack_918._0_8_;
      pcVar11 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_918._0_8_ + 0x40)
                        )->seqtree;
      pfStack_930 = (fdb_kvs_handle *)0x117ce6;
      iVar7 = bcmp(pcVar11,handle,(size_t)((fdb_kvs_config *)auStack_918._0_8_)->custom_cmp_param);
      if (iVar7 != 0) goto LAB_00117e11;
      pfStack_930 = (fdb_kvs_handle *)0x117cf6;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar10 = (int)pcVar16 + 1;
      pcVar16 = (char *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_930 = (fdb_kvs_handle *)0x117d0d;
        fdb_close((fdb_file_handle *)auStack_8f8._0_8_);
        pfStack_930 = (fdb_kvs_handle *)0x117d17;
        fdb_close(pfStack_900);
        pfStack_930 = (fdb_kvs_handle *)0x117d21;
        fdb_close((fdb_file_handle *)auStack_8f8._16_8_);
        lVar12 = 0;
        do {
          pfStack_930 = (fdb_kvs_handle *)0x117d30;
          fdb_doc_free(*(fdb_doc **)(auStack_7b8 + lVar12 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 10);
        pfStack_930 = (fdb_kvs_handle *)0x117d3e;
        fdb_shutdown();
        pfStack_930 = (fdb_kvs_handle *)0x117d43;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_930 = (fdb_kvs_handle *)0x117d74;
        fprintf(_stderr,pcVar11,"transaction test");
        return;
      }
    }
    goto LAB_00117e1e;
  }
  goto LAB_00117e6f;
LAB_0011849b:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184a8;
  transaction_simple_api_test();
  pfVar14 = pfVar13;
LAB_001184a8:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184ad;
  transaction_simple_api_test();
LAB_001184ad:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184ba;
  transaction_simple_api_test();
  pfVar13 = pfVar14;
LAB_001184ba:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184bf;
  transaction_simple_api_test();
LAB_001184bf:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184cc;
  transaction_simple_api_test();
  pfVar9 = pfVar13;
LAB_001184cc:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184d1;
  transaction_simple_api_test();
LAB_001184d1:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184de;
  transaction_simple_api_test();
  pfVar13 = pfVar9;
LAB_001184de:
  pfVar9 = pfVar13;
  pfStack_cc8 = (fdb_kvs_handle *)0x1184e3;
  transaction_simple_api_test();
LAB_001184e3:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184e8;
  transaction_simple_api_test();
LAB_001184e8:
  pfVar14 = pfVar9;
  pfStack_cc8 = (fdb_kvs_handle *)0x1184ed;
  transaction_simple_api_test();
LAB_001184ed:
  pfStack_cc8 = (fdb_kvs_handle *)0x1184fa;
  transaction_simple_api_test();
LAB_001184fa:
  pfVar9 = (fdb_kvs_handle *)auStack_c50;
  pfStack_cc8 = (fdb_kvs_handle *)0x118507;
  transaction_simple_api_test();
  pfVar13 = (fdb_kvs_handle *)pcVar16;
  goto LAB_00118507;
LAB_00117d8b:
  pfStack_930 = (fdb_kvs_handle *)0x117d90;
  transaction_test();
LAB_00117d90:
  pfVar9 = (fdb_kvs_handle *)auStack_918;
  config = (fdb_kvs_handle *)(auStack_7b8 + 0x50);
  pcVar11 = "key%d";
  pfStack_930 = (fdb_kvs_handle *)0x117d95;
  transaction_test();
LAB_00117d95:
  pfStack_930 = (fdb_kvs_handle *)0x117da0;
  transaction_test();
  pcVar16 = (char *)pfVar13;
  handle = pfVar14;
  pfVar14 = pfVar9;
LAB_00117da0:
  pfStack_930 = (fdb_kvs_handle *)0x117da5;
  transaction_test();
LAB_00117da5:
  pfStack_930 = (fdb_kvs_handle *)0x117db2;
  transaction_test();
  pfVar13 = handle;
LAB_00117db2:
  handle = pfVar13;
  pfStack_930 = (fdb_kvs_handle *)0x117db7;
  transaction_test();
  pfVar9 = pfVar14;
LAB_00117db7:
  pfStack_930 = (fdb_kvs_handle *)0x117dc4;
  transaction_test();
LAB_00117dc4:
  pfStack_930 = (fdb_kvs_handle *)0x117dc9;
  transaction_test();
LAB_00117dc9:
  pfStack_930 = (fdb_kvs_handle *)0x117dd6;
  transaction_test();
LAB_00117dd6:
  pfStack_930 = (fdb_kvs_handle *)0x117ddb;
  transaction_test();
LAB_00117ddb:
  pfStack_930 = (fdb_kvs_handle *)0x117de8;
  transaction_test();
LAB_00117de8:
  pfStack_930 = (fdb_kvs_handle *)0x117ded;
  transaction_test();
LAB_00117ded:
  pfStack_930 = (fdb_kvs_handle *)0x117dfa;
  transaction_test();
LAB_00117dfa:
  pfStack_930 = (fdb_kvs_handle *)0x117dff;
  transaction_test();
LAB_00117dff:
  pfStack_930 = (fdb_kvs_handle *)0x117e0c;
  transaction_test();
LAB_00117e0c:
  pfStack_930 = (fdb_kvs_handle *)0x117e11;
  transaction_test();
LAB_00117e11:
  pfStack_930 = (fdb_kvs_handle *)0x117e1e;
  transaction_test();
LAB_00117e1e:
  pfStack_930 = (fdb_kvs_handle *)0x117e23;
  transaction_test();
  pfVar13 = (fdb_kvs_handle *)pcVar16;
  pfVar14 = handle;
LAB_00117e23:
  pfStack_930 = (fdb_kvs_handle *)0x117e28;
  transaction_test();
LAB_00117e28:
  pfStack_930 = (fdb_kvs_handle *)0x117e2d;
  transaction_test();
LAB_00117e2d:
  pfStack_930 = (fdb_kvs_handle *)0x117e32;
  transaction_test();
LAB_00117e32:
  pfStack_930 = (fdb_kvs_handle *)0x117e37;
  transaction_test();
LAB_00117e37:
  pfStack_930 = (fdb_kvs_handle *)0x117e3c;
  transaction_test();
LAB_00117e3c:
  pfStack_930 = (fdb_kvs_handle *)0x117e41;
  transaction_test();
LAB_00117e41:
  pfStack_930 = (fdb_kvs_handle *)0x117e46;
  transaction_test();
  pcVar16 = (char *)pfVar13;
  handle = pfVar14;
LAB_00117e46:
  pfStack_930 = (fdb_kvs_handle *)0x117e4b;
  transaction_test();
  pfVar13 = (fdb_kvs_handle *)pcVar11;
LAB_00117e4b:
  pcVar11 = (char *)pfVar13;
  pfStack_930 = (fdb_kvs_handle *)0x117e50;
  transaction_test();
LAB_00117e50:
  pfStack_930 = (fdb_kvs_handle *)0x117e5d;
  transaction_test();
LAB_00117e5d:
  pfStack_930 = (fdb_kvs_handle *)0x117e62;
  transaction_test();
LAB_00117e62:
  pfStack_930 = (fdb_kvs_handle *)0x117e6f;
  transaction_test();
LAB_00117e6f:
  pfStack_930 = (fdb_kvs_handle *)transaction_simple_api_test;
  transaction_test();
  pfStack_cc8 = (fdb_kvs_handle *)0x117e91;
  pfStack_958 = (fdb_kvs_handle *)pcVar11;
  pfStack_950 = (fdb_kvs_handle *)pcVar16;
  pfStack_948 = handle;
  pfStack_940 = config;
  pfStack_938 = pfVar9;
  pfStack_930 = doc_00;
  gettimeofday(&tStack_c60,(__timezone_ptr_t)0x0);
  pfStack_cc8 = (fdb_kvs_handle *)0x117e96;
  memleak_start();
  pfStack_cc8 = (fdb_kvs_handle *)0x117ea2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_cc8 = (fdb_kvs_handle *)0x117eb2;
  fdb_get_default_config();
  config_00 = &fStack_c78;
  pfStack_cc8 = (fdb_kvs_handle *)0x117ebf;
  fdb_get_default_kvs_config();
  fStack_a50.buffercache_size = 0;
  fStack_a50.wal_threshold = 0x400;
  fStack_a50.flags = 1;
  fStack_a50.purging_interval = 0;
  fStack_a50.compaction_threshold = '\0';
  pfVar13 = (fdb_kvs_handle *)&phStack_c80;
  pfStack_cc8 = (fdb_kvs_handle *)0x117ef8;
  fdb_open((fdb_file_handle **)pfVar13,"./mvcc_test1",&fStack_a50);
  pfVar14 = (fdb_kvs_handle *)&pfStack_ca8;
  pfStack_cc8 = (fdb_kvs_handle *)0x117f0b;
  fdb_kvs_open_default((fdb_file_handle *)phStack_c80,(fdb_kvs_handle **)pfVar14,config_00);
  pfStack_cc8 = (fdb_kvs_handle *)0x117f21;
  pfVar9 = pfStack_ca8;
  fVar3 = fdb_set_log_callback(pfStack_ca8,logCallbackFunc,"transaction_simple_api_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcVar11 = auStack_c50 + 0x100;
    pcVar16 = "body%d";
    doc_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x117f52;
      sprintf(pcVar11,"key%d",doc_00);
      pfStack_cc8 = (fdb_kvs_handle *)0x117f61;
      sprintf(auStack_c50,"body%d",doc_00);
      handle = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x117f6e;
      pfVar13 = (fdb_kvs_handle *)strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x117f79;
      sVar4 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x117f8d;
      fVar3 = fdb_set_kv(handle,pcVar11,(size_t)pfVar13,auStack_c50,sVar4);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_cc8 = (fdb_kvs_handle *)0x11849b;
        transaction_simple_api_test();
        goto LAB_0011849b;
      }
      uVar10 = (int)doc_00 + 1;
      doc_00 = (fdb_kvs_handle *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x117fa8;
    fdb_commit((fdb_file_handle *)phStack_c80,'\0');
    pfStack_cc8 = (fdb_kvs_handle *)0x117fca;
    fdb_open((fdb_file_handle **)&phStack_c88,"./mvcc_test1",&fStack_a50);
    pfStack_cc8 = (fdb_kvs_handle *)0x117fdd;
    fdb_open((fdb_file_handle **)&pkStack_c90,"./mvcc_test1",&fStack_a50);
    pfStack_cc8 = (fdb_kvs_handle *)0x117ff2;
    fdb_kvs_open_default((fdb_file_handle *)phStack_c88,&pfStack_c98,&fStack_c78);
    pfStack_cc8 = (fdb_kvs_handle *)0x118003;
    fdb_kvs_open_default((fdb_file_handle *)pkStack_c90,&pfStack_ca0,&fStack_c78);
    pfStack_cc8 = (fdb_kvs_handle *)0x118010;
    fdb_begin_transaction((fdb_file_handle *)phStack_c88,'\x02');
    pfStack_cc8 = (fdb_kvs_handle *)0x11801e;
    fdb_begin_transaction((fdb_file_handle *)pkStack_c90,'\x02');
    pcVar11 = auStack_c50 + 0x100;
    uVar10 = 0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x118043;
      sprintf(pcVar11,"key%d",(ulong)uVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x118056;
      sprintf(auStack_c50,"body%d_txn1",(ulong)uVar10);
      pfVar13 = pfStack_c98;
      pfStack_cc8 = (fdb_kvs_handle *)0x118063;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x11806e;
      sVar5 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x118082;
      fdb_set_kv(pfVar13,pcVar11,sVar4,auStack_c50,sVar5);
      pfStack_cc8 = (fdb_kvs_handle *)0x118091;
      sprintf(pcVar11,"key%d",(ulong)uVar10);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180a4;
      sprintf(auStack_c50,"body%d_txn2",(ulong)uVar10);
      pfVar13 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x1180b1;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180bc;
      sVar5 = strlen(auStack_c50);
      pfStack_cc8 = (fdb_kvs_handle *)0x1180d0;
      fdb_set_kv(pfVar13,pcVar11,sVar4,auStack_c50,sVar5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    pcVar11 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pcVar16 = (char *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x118109;
      sprintf(pcVar11,"key%d",pcVar16);
      pfStack_cc8 = (fdb_kvs_handle *)0x11811d;
      sprintf(auStack_c50,"body%d",pcVar16);
      pfVar14 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x11812a;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x11813e;
      fVar3 = fdb_get_kv(pfVar14,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184a8;
      pfStack_cc8 = (fdb_kvs_handle *)0x11815b;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_0011849b;
      pfStack_cc8 = (fdb_kvs_handle *)0x11816b;
      fdb_free_block(pfVar13);
      pfStack_cc8 = (fdb_kvs_handle *)0x11817f;
      sprintf(pcVar11,"key%d",pcVar16);
      pfStack_cc8 = (fdb_kvs_handle *)0x118193;
      sprintf(auStack_c50,"body%d_txn1",pcVar16);
      pfVar13 = pfStack_c98;
      pfStack_cc8 = (fdb_kvs_handle *)0x1181a0;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181b4;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar14 = pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184ba;
      pfStack_cc8 = (fdb_kvs_handle *)0x1181d1;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_001184ad;
      pfStack_cc8 = (fdb_kvs_handle *)0x1181e1;
      fdb_free_block(pfVar14);
      pfStack_cc8 = (fdb_kvs_handle *)0x1181f5;
      sprintf(pcVar11,"key%d",pcVar16);
      pfStack_cc8 = (fdb_kvs_handle *)0x118209;
      sprintf(auStack_c50,"body%d_txn2",pcVar16);
      pfVar9 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x118216;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x11822a;
      fVar3 = fdb_get_kv(pfVar9,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar13 = pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184cc;
      pfStack_cc8 = (fdb_kvs_handle *)0x118247;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_001184bf;
      pfStack_cc8 = (fdb_kvs_handle *)0x118257;
      fdb_free_block(pfVar13);
      uVar10 = (int)pcVar16 + 1;
      pcVar16 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x118270;
    fdb_end_transaction((fdb_file_handle *)phStack_c88,'\0');
    pcVar11 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pcVar16 = (char *)0x0;
    do {
      pfStack_cc8 = (fdb_kvs_handle *)0x11829e;
      sprintf(pcVar11,"key%d",pcVar16);
      pfStack_cc8 = (fdb_kvs_handle *)0x1182b2;
      sprintf(auStack_c50,"body%d_txn1",pcVar16);
      pfVar13 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x1182bf;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x1182d3;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar9 = pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184de;
      pfStack_cc8 = (fdb_kvs_handle *)0x1182f0;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_001184d1;
      pfStack_cc8 = (fdb_kvs_handle *)0x118300;
      fVar3 = fdb_free_block(pfVar9);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e3;
      pfStack_cc8 = (fdb_kvs_handle *)0x11831c;
      sprintf(pcVar11,"key%d",pcVar16);
      pfStack_cc8 = (fdb_kvs_handle *)0x118330;
      sprintf(auStack_c50,"body%d_txn2",pcVar16);
      pfVar9 = pfStack_ca0;
      pfStack_cc8 = (fdb_kvs_handle *)0x11833d;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x118351;
      fVar3 = fdb_get_kv(pfVar9,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pfVar14 = pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001184e8;
      pfStack_cc8 = (fdb_kvs_handle *)0x11836e;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_001184ed;
      pfStack_cc8 = (fdb_kvs_handle *)0x11837e;
      fdb_free_block(pfVar14);
      uVar10 = (int)pcVar16 + 1;
      pcVar16 = (char *)(ulong)uVar10;
    } while (uVar10 != 10);
    pfStack_cc8 = (fdb_kvs_handle *)0x118397;
    fdb_end_transaction((fdb_file_handle *)pkStack_c90,'\0');
    pcVar11 = auStack_c50 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_cb8;
    doc_00 = (fdb_kvs_handle *)&p_Stack_cb0;
    pfVar14 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_cc8 = (fdb_kvs_handle *)0x1183c3;
      sprintf(pcVar11,"key%d",pfVar14);
      pfStack_cc8 = (fdb_kvs_handle *)0x1183d6;
      sprintf(auStack_c50,"body%d_txn2",pfVar14);
      pfVar13 = pfStack_ca8;
      pfStack_cc8 = (fdb_kvs_handle *)0x1183e3;
      sVar4 = strlen(pcVar11);
      pfStack_cc8 = (fdb_kvs_handle *)0x1183f7;
      pfVar9 = pfVar13;
      fVar3 = fdb_get_kv(pfVar13,pcVar11,sVar4,(void **)handle,(size_t *)doc_00);
      pcVar16 = (char *)pfStack_cb8;
      if (fVar3 != FDB_RESULT_SUCCESS) break;
      pfStack_cc8 = (fdb_kvs_handle *)0x118414;
      iVar7 = bcmp(pfStack_cb8,auStack_c50,(size_t)p_Stack_cb0);
      if (iVar7 != 0) goto LAB_001184fa;
      pfStack_cc8 = (fdb_kvs_handle *)0x118424;
      fdb_free_block(pcVar16);
      uVar10 = (int)pfVar14 + 1;
      pfVar14 = (fdb_kvs_handle *)(ulong)uVar10;
      if (uVar10 == 10) {
        pfStack_cc8 = (fdb_kvs_handle *)0x118435;
        fdb_close((fdb_file_handle *)phStack_c80);
        pfStack_cc8 = (fdb_kvs_handle *)0x11843f;
        fdb_close((fdb_file_handle *)phStack_c88);
        pfStack_cc8 = (fdb_kvs_handle *)0x118449;
        fdb_close((fdb_file_handle *)pkStack_c90);
        pfStack_cc8 = (fdb_kvs_handle *)0x11844e;
        fdb_shutdown();
        pfStack_cc8 = (fdb_kvs_handle *)0x118453;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_cc8 = (fdb_kvs_handle *)0x118484;
        fprintf(_stderr,pcVar11,"transaction simple API test");
        return;
      }
    }
LAB_00118507:
    config_00 = (fdb_kvs_config *)(auStack_c50 + 0x100);
    pcVar16 = auStack_c50;
    pfStack_cc8 = (fdb_kvs_handle *)0x11850c;
    transaction_simple_api_test();
  }
  pfStack_cc8 = (fdb_kvs_handle *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_cf0 = pfVar14;
  pfStack_ce8 = (fdb_kvs_handle *)pcVar16;
  pfStack_ce0 = handle;
  pfStack_cd8 = config_00;
  pfStack_cd0 = pfVar13;
  pfStack_cc8 = doc_00;
  gettimeofday(&tStack_f08,(__timezone_ptr_t)0x0);
  fVar3 = fdb_snapshot_open(pfVar9,&pfStack_f10,0xffffffffffffffff);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_init(pfStack_f10,&pfStack_f20,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar8 = 0;
  do {
    uVar10 = (uint)uVar8;
    pfStack_f18 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_get(pfStack_f20,&pfStack_f18);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_df8,"key%d",uVar8);
    sprintf(acStack_ef8,"body%d",uVar8);
    doc = pfStack_f18;
    pvVar1 = pfStack_f18->key;
    iVar7 = bcmp(pvVar1,acStack_df8,pfStack_f18->keylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_df8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = doc->body;
    iVar7 = bcmp(pvVar1,acStack_ef8,doc->bodylen);
    if (iVar7 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_ef8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar10 = uVar10 + 1;
    uVar8 = (ulong)uVar10;
    fdb_doc_free(doc);
    fVar3 = fdb_iterator_next(pfStack_f20);
  } while (fVar3 == FDB_RESULT_SUCCESS);
  if (uVar10 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_iterator_close(pfStack_f20);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar3 = fdb_kvs_close(pfStack_f10);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void rollback_and_snapshot_test()
{
    TEST_INIT();

    memleak_start();

    fdb_seqnum_t seqnum, rollback_seqnum;
    fdb_kvs_info kvs_info;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db,  *snapshot;
    int r;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // MB-12530 open db
    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "mvcc_test", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 2. Create Key 'a' and Commit
    status = fdb_set_kv(db, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 3. Create Key 'b' and Commit
    status = fdb_set_kv(db, (void *)"b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 4.  Remember this as our rollback point
    rollback_seqnum = seqnum;

    // 5. Create Key 'c' and Commit
    status = fdb_set_kv(db, (void *)"c", 1,(void *) "val-c", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 6. Rollback to rollback point (seq 2)
    status = fdb_rollback(&db, rollback_seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    seqnum = kvs_info.last_seqnum;

    // 7. Verify that Key 'c' is not found
    void *val;
    size_t vallen;
    status = fdb_get_kv(db, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // 8. Open a snapshot at the same point
    status = fdb_snapshot_open(db, &snapshot, seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // 9. Verify that Key 'c' is not found
    status = fdb_get_kv(snapshot, (void *)"c", 1, &val, &vallen);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // close the snapshot db
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("rollback and snapshot test");
}